

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cc
# Opt level: O2

uint64_t __thiscall flow::MatchRegEx::evaluate(MatchRegEx *this,FlowString *condition,Runner *env)

{
  pointer ppVar1;
  bool bVar2;
  Result *in_RAX;
  undefined7 extraout_var;
  pair<flow::util::RegExp,_unsigned_long> *one;
  pointer this_00;
  Result *result;
  
  if ((RegExpContext *)env->userdata_ == (RegExpContext *)0x0) {
    result = (Result *)0x0;
  }
  else {
    in_RAX = util::RegExpContext::regexMatch_abi_cxx11_((RegExpContext *)env->userdata_);
    result = in_RAX;
  }
  this_00 = (this->map_).
            super__Vector_base<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->map_).
           super__Vector_base<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_00 == ppVar1) {
LAB_0015c589:
      if (this_00 == ppVar1) {
        in_RAX = (Result *)(this->super_Match).def_.elsePC;
      }
      return (uint64_t)in_RAX;
    }
    bVar2 = util::RegExp::match(&this_00->first,condition,result);
    in_RAX = (Result *)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      in_RAX = (Result *)this_00->second;
      goto LAB_0015c589;
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

uint64_t MatchRegEx::evaluate(const FlowString* condition, Runner* env) const {
  util::RegExpContext* cx = reinterpret_cast<util::RegExpContext*>(env->userdata());
  util::RegExp::Result* rs = cx ? cx->regexMatch() : nullptr;
  for (const std::pair<util::RegExp, uint64_t>& one : map_) {
    if (one.first.match(*condition, rs)) {
      return one.second;
    }
  }

  return def_.elsePC;  // no match found
}